

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::decodeObject
          (JsonCodec *this,Reader input,StructSchema type,Orphanage orphanage,Builder output)

{
  Field fieldSchema;
  Reader fieldValue;
  StringPtr name;
  Fault f;
  Reader field;
  IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
  local_1b0;
  Schema local_1a0;
  Schema local_198;
  undefined8 uStack_190;
  SegmentReader *local_188;
  CapTableReader *pCStack_180;
  void *local_178;
  WirePointer *pWStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  Reader local_150;
  Maybe<capnp::StructSchema::Field> local_120;
  Reader local_d8;
  Reader local_a8;
  StructSchema local_70;
  undefined8 uStack_68;
  SegmentReader *local_60;
  CapTableReader *pCStack_58;
  void *local_50;
  WirePointer *pWStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1a0 = type.super_Schema.raw;
  if ((input._reader.dataSize < 0x10) || (*input._reader.data != 5)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x180,FAILED,"input.isObject()","\"Expected object value\"",
               (char (*) [22])"Expected object value");
    kj::_::Debug::Fault::~Fault((Fault *)&local_120);
  }
  else {
    capnp::json::Value::Reader::getObject(&local_a8,&input);
    local_1b0.container = &local_a8;
    for (local_1b0.index = 0; local_1b0.index != local_a8.reader.elementCount;
        local_1b0.index = local_1b0.index + 1) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
      ::operator*(&local_d8,&local_1b0);
      name.content = (ArrayPtr<const_char>)capnp::json::Value::Field::Reader::getName(&local_d8);
      StructSchema::findFieldByName(&local_120,(StructSchema *)&local_1a0,name);
      if (local_120.ptr.isSet == true) {
        local_40 = local_120.ptr.field_1._48_8_;
        uStack_38 = local_120.ptr.field_1._56_8_;
        local_50 = local_120.ptr.field_1.value.proto._reader.data;
        pWStack_48 = local_120.ptr.field_1.value.proto._reader.pointers;
        local_60 = local_120.ptr.field_1.value.proto._reader.segment;
        pCStack_58 = local_120.ptr.field_1.value.proto._reader.capTable;
        local_70.super_Schema.raw =
             (Schema)(Schema)local_120.ptr.field_1.value.parent.super_Schema.raw;
        uStack_68 = local_120.ptr.field_1._8_8_;
        local_198.raw = (RawBrandedSchema *)local_120.ptr.field_1.value.parent.super_Schema.raw;
        uStack_190 = local_120.ptr.field_1._8_8_;
        local_188 = local_120.ptr.field_1.value.proto._reader.segment;
        pCStack_180 = local_120.ptr.field_1.value.proto._reader.capTable;
        local_178 = local_120.ptr.field_1.value.proto._reader.data;
        pWStack_170 = local_120.ptr.field_1.value.proto._reader.pointers;
        local_168 = local_120.ptr.field_1._48_8_;
        uStack_160 = local_120.ptr.field_1._56_8_;
        capnp::json::Value::Field::Reader::getValue(&local_150,&local_d8);
        fieldSchema._8_8_ = uStack_190;
        fieldSchema.parent.super_Schema.raw = (Schema)(Schema)local_198.raw;
        fieldSchema.proto._reader.segment = local_188;
        fieldSchema.proto._reader.capTable = pCStack_180;
        fieldSchema.proto._reader.data = local_178;
        fieldSchema.proto._reader.pointers = pWStack_170;
        fieldSchema.proto._reader.dataSize = (undefined4)local_168;
        fieldSchema.proto._reader.pointerCount = local_168._4_2_;
        fieldSchema.proto._reader._38_2_ = local_168._6_2_;
        fieldSchema.proto._reader._40_8_ = uStack_160;
        fieldValue._reader.capTable = local_150._reader.capTable;
        fieldValue._reader.segment = local_150._reader.segment;
        fieldValue._reader.data = local_150._reader.data;
        fieldValue._reader.pointers = local_150._reader.pointers;
        fieldValue._reader.dataSize = local_150._reader.dataSize;
        fieldValue._reader.pointerCount = local_150._reader.pointerCount;
        fieldValue._reader._38_2_ = local_150._reader._38_2_;
        fieldValue._reader.nestingLimit = local_150._reader.nestingLimit;
        fieldValue._reader._44_4_ = local_150._reader._44_4_;
        decodeField(this,fieldSchema,fieldValue,orphanage,output);
      }
    }
  }
  return;
}

Assistant:

void JsonCodec::decodeObject(JsonValue::Reader input, StructSchema type, Orphanage orphanage, DynamicStruct::Builder output) const {
  KJ_REQUIRE(input.isObject(), "Expected object value") { return; }
  for (auto field: input.getObject()) {
    KJ_IF_MAYBE(fieldSchema, type.findFieldByName(field.getName())) {
      decodeField(*fieldSchema, field.getValue(), orphanage, output);
    } else {
      // Unknown json fields are ignored to allow schema evolution
    }
  }
}